

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigTempor.c
# Opt level: O3

Aig_Man_t *
Saig_ManTempor(Aig_Man_t *pAig,int nFrames,int TimeOut,int nConfLimit,int fUseBmc,int fUseTransSigs,
              int fVerbose,int fVeryVerbose)

{
  bool bVar1;
  int iVar2;
  Aig_Man_t *pAVar3;
  int *__ptr;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  Vec_Int_t *vTransSigs;
  int local_38;
  int nFramesFinished;
  
  vTransSigs = (Vec_Int_t *)0x0;
  nFramesFinished = -1;
  local_38 = fUseTransSigs;
  if (nFrames < 0) {
    __assert_fail("nFrames >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigTempor.c"
                  ,0xc0,"Aig_Man_t *Saig_ManTempor(Aig_Man_t *, int, int, int, int, int, int, int)")
    ;
  }
  pAVar3 = pAig;
  if (nFrames == 0) {
    uVar10 = Saig_ManPhasePrefixLength(pAig,fVerbose,fVeryVerbose,&vTransSigs);
    if (uVar10 == 1) {
      if (vTransSigs != (Vec_Int_t *)0x0) {
        if (vTransSigs->pArray != (int *)0x0) {
          free(vTransSigs->pArray);
          vTransSigs->pArray = (int *)0x0;
        }
        free(vTransSigs);
        vTransSigs = (Vec_Int_t *)0x0;
      }
      pcVar8 = "The leading sequence has length 1. Temporal decomposition is not performed.";
LAB_006fa145:
      puts(pcVar8);
      return (Aig_Man_t *)0x0;
    }
    if (uVar10 == 0) {
      if (vTransSigs != (Vec_Int_t *)0x0) {
        if (vTransSigs->pArray != (int *)0x0) {
          free(vTransSigs->pArray);
          vTransSigs->pArray = (int *)0x0;
        }
        free(vTransSigs);
        vTransSigs = (Vec_Int_t *)0x0;
      }
      pcVar8 = "The leading sequence has length 0. Temporal decomposition is not performed.";
      goto LAB_006fa145;
    }
    if ((local_38 == 0) || ((long)vTransSigs->nSize < 1)) {
LAB_006fa1a2:
      uVar7 = (ulong)uVar10;
    }
    else {
      uVar7 = 0xffffffff;
      uVar9 = 0;
      do {
        if (vTransSigs->pArray[uVar9] != 0) {
          uVar7 = uVar9 & 0xffffffff;
        }
        uVar9 = uVar9 + 1;
      } while ((long)vTransSigs->nSize != uVar9);
      if ((int)uVar10 <= (int)uVar7 || (int)uVar7 < 1) goto LAB_006fa1a2;
      Abc_Print((int)pAVar3,"Reducing frame count from %d to %d to fit the last transient.\n",
                (ulong)uVar10,uVar7);
    }
    pcVar8 = "Using computed frame number (%d).\n";
  }
  else {
    uVar7 = (ulong)(uint)nFrames;
    pcVar8 = "Using user-given frame number (%d).\n";
  }
  uVar10 = (uint)uVar7;
  Abc_Print((int)pAVar3,pcVar8,uVar7);
  if (fUseBmc == 0) {
LAB_006fa019:
    if (vTransSigs != (Vec_Int_t *)0x0) {
      if (vTransSigs->pArray != (int *)0x0) {
        free(vTransSigs->pArray);
        vTransSigs->pArray = (int *)0x0;
      }
      free(vTransSigs);
      vTransSigs = (Vec_Int_t *)0x0;
    }
    pAVar3 = Saig_ManTemporDecompose(pAig,uVar10);
  }
  else {
    iVar2 = Saig_BmcPerform(pAig,0,uVar10,2000,TimeOut,nConfLimit,0,fVerbose,0,&nFramesFinished,0,0)
    ;
    if (iVar2 == 0) {
      if (vTransSigs != (Vec_Int_t *)0x0) {
        if (vTransSigs->pArray != (int *)0x0) {
          free(vTransSigs->pArray);
          vTransSigs->pArray = (int *)0x0;
        }
        free(vTransSigs);
        vTransSigs = (Vec_Int_t *)0x0;
      }
      pcVar8 = "A cex found in the first %d frames.\n";
    }
    else {
      if ((int)uVar10 <= nFramesFinished + 1) goto LAB_006fa019;
      if (vTransSigs != (Vec_Int_t *)0x0) {
        uVar4 = vTransSigs->nSize;
        uVar6 = vTransSigs->nSize - 1;
        do {
          uVar5 = uVar6;
          if ((int)uVar4 < 1) {
            __ptr = vTransSigs->pArray;
            if (__ptr != (int *)0x0) goto LAB_006fa1b9;
            goto LAB_006fa1ce;
          }
          uVar10 = uVar4 - 1;
          uVar6 = uVar5 - 1;
          bVar1 = nFramesFinished < (int)uVar4;
          uVar4 = uVar10;
        } while ((bVar1) || (__ptr = vTransSigs->pArray, __ptr[uVar5] == 0));
        if ((local_38 != 0) && (0 < (int)uVar10)) {
          if ((uint)nFramesFinished <= uVar10) {
            __assert_fail("iLastBefore < nFramesFinished",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigTempor.c"
                          ,0xf2,
                          "Aig_Man_t *Saig_ManTempor(Aig_Man_t *, int, int, int, int, int, int, int)"
                         );
          }
          printf("BMC succeeded to frame %d. Adjusting frame count to be (%d) based on the last transient signal.\n"
                 ,(ulong)(uint)nFramesFinished,(ulong)uVar10);
          goto LAB_006fa019;
        }
LAB_006fa1b9:
        free(__ptr);
        vTransSigs->pArray = (int *)0x0;
LAB_006fa1ce:
        free(vTransSigs);
        vTransSigs = (Vec_Int_t *)0x0;
      }
      pcVar8 = "BMC for %d frames could not be completed. A cex may exist!\n";
    }
    pAVar3 = (Aig_Man_t *)0x0;
    printf(pcVar8,uVar7);
  }
  return pAVar3;
}

Assistant:

Aig_Man_t * Saig_ManTempor( Aig_Man_t * pAig, int nFrames, int TimeOut, int nConfLimit, int fUseBmc, int fUseTransSigs, int fVerbose, int fVeryVerbose )
{ 
    extern int Saig_ManPhasePrefixLength( Aig_Man_t * p, int fVerbose, int fVeryVerbose, Vec_Int_t ** pvTrans );

    Vec_Int_t * vTransSigs = NULL;
    int RetValue, nFramesFinished = -1;
    assert( nFrames >= 0 ); 
    if ( nFrames == 0 )
    {
        nFrames = Saig_ManPhasePrefixLength( pAig, fVerbose, fVeryVerbose, &vTransSigs );
        if ( nFrames == 0 )
        {
            Vec_IntFreeP( &vTransSigs );
            printf( "The leading sequence has length 0. Temporal decomposition is not performed.\n" );
            return NULL;
        }
        if ( nFrames == 1 )
        {
            Vec_IntFreeP( &vTransSigs );
            printf( "The leading sequence has length 1. Temporal decomposition is not performed.\n" );
            return NULL;
        }
        if ( fUseTransSigs )
        {
            int Entry, i, iLast = -1;
            Vec_IntForEachEntry( vTransSigs, Entry, i )
                iLast = Entry ? i :iLast;
            if ( iLast > 0 && iLast < nFrames )
            {
                Abc_Print( 1, "Reducing frame count from %d to %d to fit the last transient.\n", nFrames, iLast );
                nFrames = iLast;
            }
        }
        Abc_Print( 1, "Using computed frame number (%d).\n", nFrames );
    }
    else
        Abc_Print( 1, "Using user-given frame number (%d).\n", nFrames );
    // run BMC2
    if ( fUseBmc )
    {
        RetValue = Saig_BmcPerform( pAig, 0, nFrames, 2000, TimeOut, nConfLimit, 0, fVerbose, 0, &nFramesFinished, 0, 0 );
        if ( RetValue == 0 )
        {
            Vec_IntFreeP( &vTransSigs );
            printf( "A cex found in the first %d frames.\n", nFrames );
            return NULL;
        }
        if ( nFramesFinished + 1 < nFrames )
        {
            int iLastBefore = Vec_IntLastNonZeroBeforeLimit( vTransSigs, nFramesFinished );
            if ( iLastBefore < 1 || !fUseTransSigs )
            {
                Vec_IntFreeP( &vTransSigs );
                printf( "BMC for %d frames could not be completed. A cex may exist!\n", nFrames );
                return NULL;
            }
            assert( iLastBefore < nFramesFinished );
            printf( "BMC succeeded to frame %d. Adjusting frame count to be (%d) based on the last transient signal.\n", nFramesFinished, iLastBefore );
            nFrames = iLastBefore;
        }
    }
    Vec_IntFreeP( &vTransSigs );
    return Saig_ManTemporDecompose( pAig, nFrames );
}